

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qchar.cpp
# Opt level: O2

char32_t convertCase_helper<char32_t>(char32_t uc,Case which)

{
  short sVar1;
  Properties *pPVar2;
  
  pPVar2 = QUnicodeTables::qGetProp(uc);
  sVar1 = (short)((uint)(int)(short)pPVar2->cases[which] >> 1);
  if (((int)(short)pPVar2->cases[which] & 1U) == 0) {
    uc = uc + sVar1;
  }
  else if (*(short *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2) == 1) {
    uc = (char32_t)*(ushort *)(QUnicodeTables::specialCaseMap + (long)sVar1 * 2 + 2);
  }
  return uc;
}

Assistant:

Q_DECL_CONST_FUNCTION static inline T convertCase_helper(T uc, QUnicodeTables::Case which) noexcept
{
    const auto fold = qGetProp(uc)->cases[which];

    if (Q_UNLIKELY(fold.special)) {
        const ushort *specialCase = specialCaseMap + fold.diff;
        // so far, there are no special cases beyond BMP (guaranteed by the qunicodetables generator)
        return *specialCase == 1 ? specialCase[1] : uc;
    }

    return uc + fold.diff;
}